

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

int nettlp_msg_socket(in_addr addr)

{
  int __fd;
  int iVar1;
  sockaddr local_20;
  
  __fd = socket(2,2,0x11);
  if (-1 < __fd) {
    local_20.sa_data[6] = '\0';
    local_20.sa_data[7] = '\0';
    local_20.sa_data[8] = '\0';
    local_20.sa_data[9] = '\0';
    local_20.sa_data[10] = '\0';
    local_20.sa_data[0xb] = '\0';
    local_20.sa_data[0xc] = '\0';
    local_20.sa_data[0xd] = '\0';
    local_20.sa_family = 2;
    local_20.sa_data[0] = '/';
    local_20.sa_data[1] = -1;
    local_20.sa_data._2_4_ = addr.s_addr;
    iVar1 = connect(__fd,&local_20,0x10);
    if (iVar1 < 0) {
      __fd = iVar1;
    }
  }
  return __fd;
}

Assistant:

static int nettlp_msg_socket(struct in_addr addr)
{
	int fd, ret;
	struct sockaddr_in saddr;

	fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (fd < 0)
		return fd;

	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = addr;
	saddr.sin_port = htons(NETTLP_MSG_PORT);
	ret = connect(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;

	return fd;
}